

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlslangToSpv.cpp
# Opt level: O3

void __thiscall
anon_unknown.dwarf_ddf01b::TGlslangToSpvTraverser::applySpirvDecorate
          (TGlslangToSpvTraverser *this,TType *type,Id id,optional<int> member)

{
  Builder *this_00;
  _Rb_tree_color _Var1;
  _Base_ptr p_Var2;
  TIntermTyped *node;
  ulong uVar3;
  int iVar4;
  Id IVar5;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  _Rb_tree_node_base *p_Var6;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  _Rb_tree_node_base *p_Var7;
  _Optional_payload_base<int> _Var8;
  const_iterator __begin2;
  _Base_ptr p_Var9;
  const_iterator __begin3;
  vector<unsigned_int,_std::allocator<unsigned_int>_> literals;
  char *string;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_78;
  undefined8 local_58;
  char *local_50;
  _Rb_tree_node_base *local_48;
  _Optional_payload_base<int> local_40;
  Builder *local_38;
  
  _Var8 = (_Optional_payload_base<int>)
          member.super__Optional_base<int,_true,_true>._M_payload.super__Optional_payload_base<int>;
  iVar4 = (*type->_vptr_TType[0xb])(type);
  if (*(long *)(CONCAT44(extraout_var,iVar4) + 0x40) == 0) {
    __assert_fail("type.getQualifier().hasSpirvDecorate()",
                  "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/SPIRV/GlslangToSpv.cpp"
                  ,0x14b8,
                  "void (anonymous namespace)::TGlslangToSpvTraverser::applySpirvDecorate(const glslang::TType &, spv::Id, std::optional<int>)"
                 );
  }
  iVar4 = (*type->_vptr_TType[0xb])(type);
  local_48 = *(_Rb_tree_node_base **)(CONCAT44(extraout_var_00,iVar4) + 0x40);
  if (local_48 != (_Rb_tree_node_base *)0x0) {
    p_Var6 = *(_Rb_tree_node_base **)((long)local_48 + 0x20);
    p_Var7 = (_Rb_tree_node_base *)((long)local_48 + 0x10);
    local_40 = (_Optional_payload_base<int>)
               member.super__Optional_base<int,_true,_true>._M_payload.
               super__Optional_payload_base<int>;
    if (p_Var6 == p_Var7) {
      uVar3 = (ulong)member.super__Optional_base<int,_true,_true>._M_payload.
                     super__Optional_payload_base<int> & 0x100000000;
    }
    else {
      this_00 = &this->builder;
      do {
        if ((TGlslangToSpvTraverser *)p_Var6[1]._M_left ==
            (TGlslangToSpvTraverser *)p_Var6[1]._M_right) {
          _Var1 = p_Var6[1]._M_color;
          _Var8._4_4_ = 0;
          _Var8._M_payload._M_value = _Var1;
          if (((ulong)local_40 & 0x100000000) == 0) {
            _Var8._M_payload = (_Storage<int,_true>)0xffffffff;
            _Var8._M_engaged = false;
            _Var8._5_3_ = 0;
            spv::Builder::addDecoration(this_00,id,_Var1,-1);
          }
          else {
            spv::Builder::addMemberDecoration(this_00,id,local_40._M_payload._M_value,_Var1,-1);
          }
        }
        else {
          local_78.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          local_78.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          local_78.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          TranslateLiterals((TGlslangToSpvTraverser *)p_Var6[1]._M_left,
                            (TVector<const_glslang::TIntermConstantUnion_*> *)p_Var6[1]._M_right,
                            &local_78);
          _Var1 = p_Var6[1]._M_color;
          _Var8._4_4_ = 0;
          _Var8._M_payload._M_value = _Var1;
          if (((ulong)local_40 & 0x100000000) == 0) {
            _Var8 = (_Optional_payload_base<int>)&local_78;
            spv::Builder::addDecoration(this_00,id,_Var1,&local_78);
          }
          else {
            spv::Builder::addMemberDecoration
                      (this_00,id,local_40._M_payload._M_value,_Var1,&local_78);
          }
          if (local_78.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_78.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                            ._M_impl.super__Vector_impl_data._M_start,
                            (long)local_78.
                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)local_78.
                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                  _M_impl.super__Vector_impl_data._M_start);
          }
        }
        p_Var6 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var6);
      } while (p_Var6 != p_Var7);
      uVar3 = (ulong)local_40 & 0x100000000;
    }
    if (uVar3 == 0) {
      p_Var7 = *(_Rb_tree_node_base **)((long)local_48 + 0x58);
      local_58 = (_Rb_tree_node_base *)((long)local_48 + 0x48);
      if (p_Var7 == local_58) {
        local_58 = (_Rb_tree_node_base *)((ulong)local_58 & 0xffffffff00000000);
      }
      else {
        local_38 = &this->builder;
        do {
          local_78.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          local_78.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_finish = (uint *)0x0;
          local_78.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (uint *)0x0;
          p_Var9 = p_Var7[1]._M_left;
          p_Var2 = p_Var7[1]._M_right;
          if (p_Var9 == p_Var2) {
            __assert_fail("!decorateId.second.empty()",
                          "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/SPIRV/GlslangToSpv.cpp"
                          ,0x14d4,
                          "void (anonymous namespace)::TGlslangToSpvTraverser::applySpirvDecorate(const glslang::TType &, spv::Id, std::optional<int>)"
                         );
          }
          do {
            node = *(TIntermTyped **)p_Var9;
            iVar4 = (*(node->super_TIntermNode)._vptr_TIntermNode[0x22])(node);
            if ((*(ulong *)(CONCAT44(extraout_var_01,iVar4) + 8) & 0x10000007f) == 2) {
              IVar5 = createSpvConstant(this,node);
            }
            else {
              iVar4 = (*(node->super_TIntermNode)._vptr_TIntermNode[0x18])(node);
              IVar5 = getSymbolId(this,(TIntermSymbol *)CONCAT44(extraout_var_02,iVar4));
            }
            local_50 = (char *)CONCAT44(local_50._4_4_,IVar5);
            if (local_78.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_finish ==
                local_78.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              std::vector<unsigned_int,_std::allocator<unsigned_int>_>::
              _M_realloc_insert<unsigned_int>
                        (&local_78,
                         (iterator)
                         local_78.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                         _M_impl.super__Vector_impl_data._M_finish,(uint *)&local_50);
            }
            else {
              *local_78.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_finish = IVar5;
              local_78.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_finish =
                   local_78.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_finish + 1;
            }
            p_Var9 = (_Base_ptr)&p_Var9->_M_parent;
          } while (p_Var9 != p_Var2);
          spv::Builder::addDecorationId(local_38,id,p_Var7[1]._M_color,&local_78);
          if (local_78.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_78.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                            ._M_impl.super__Vector_impl_data._M_start,
                            (long)local_78.
                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)local_78.
                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                  _M_impl.super__Vector_impl_data._M_start);
          }
          p_Var7 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var7);
        } while (p_Var7 != local_58);
        local_58 = (_Rb_tree_node_base *)((ulong)local_58 & 0xffffffff00000000);
      }
    }
    else {
      local_58 = (_Rb_tree_node_base *)CONCAT44(local_58._4_4_,(int)CONCAT71(_Var8._1_7_,1));
      if (*(long *)((long)local_48 + 0x68) != 0) {
        __assert_fail("spirvDecorate.decorateIds.empty()",
                      "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/SPIRV/GlslangToSpv.cpp"
                      ,0x14d0,
                      "void (anonymous namespace)::TGlslangToSpvTraverser::applySpirvDecorate(const glslang::TType &, spv::Id, std::optional<int>)"
                     );
      }
    }
    p_Var7 = *(_Rb_tree_node_base **)((long)local_48 + 0x90);
    local_48 = (_Rb_tree_node_base *)((long)local_48 + 0x80);
    if (p_Var7 != local_48) {
      do {
        local_78.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        local_78.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        local_78.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        p_Var9 = p_Var7[1]._M_left;
        p_Var2 = p_Var7[1]._M_right;
        if (p_Var9 == p_Var2) {
          __assert_fail("!decorateString.second.empty()",
                        "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/SPIRV/GlslangToSpv.cpp"
                        ,0x14e2,
                        "void (anonymous namespace)::TGlslangToSpvTraverser::applySpirvDecorate(const glslang::TType &, spv::Id, std::optional<int>)"
                       );
        }
        do {
          local_50 = *(char **)(**(long **)(*(long *)(*(long *)p_Var9 + 0xc0) + 8) + 8);
          if (local_78.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_finish ==
              local_78.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<char_const*,std::allocator<char_const*>>::
            _M_realloc_insert<char_const*const&>
                      ((vector<char_const*,std::allocator<char_const*>> *)&local_78,
                       (iterator)
                       local_78.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                       _M_impl.super__Vector_impl_data._M_finish,&local_50);
          }
          else {
            *(char **)local_78.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_finish = local_50;
            local_78.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_finish =
                 (pointer)((long)local_78.
                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                 _M_impl.super__Vector_impl_data._M_finish + 8);
          }
          p_Var9 = (_Base_ptr)&p_Var9->_M_parent;
        } while (p_Var9 != p_Var2);
        if ((char)local_58 == '\0') {
          spv::Builder::addDecoration
                    (&this->builder,id,p_Var7[1]._M_color,
                     (vector<const_char_*,_std::allocator<const_char_*>_> *)&local_78);
        }
        else {
          spv::Builder::addMemberDecoration
                    (&this->builder,id,local_40._M_payload._M_value,p_Var7[1]._M_color,
                     (vector<const_char_*,_std::allocator<const_char_*>_> *)&local_78);
        }
        if (local_78.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_78.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start,
                          (long)local_78.
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_78.
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_start);
        }
        p_Var7 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var7);
      } while (p_Var7 != local_48);
    }
    return;
  }
  __assert_fail("spirvDecorate",
                "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/glslang/MachineIndependent/../Include/Types.h"
                ,0x435,"const TSpirvDecorate &glslang::TQualifier::getSpirvDecorate() const");
}

Assistant:

void TGlslangToSpvTraverser::applySpirvDecorate(const glslang::TType& type, spv::Id id, std::optional<int> member)
{
    assert(type.getQualifier().hasSpirvDecorate());

    const glslang::TSpirvDecorate& spirvDecorate = type.getQualifier().getSpirvDecorate();

    // Add spirv_decorate
    for (auto& decorate : spirvDecorate.decorates) {
        if (!decorate.second.empty()) {
            std::vector<unsigned> literals;
            TranslateLiterals(decorate.second, literals);
            if (member.has_value())
                builder.addMemberDecoration(id, *member, static_cast<spv::Decoration>(decorate.first), literals);
            else
                builder.addDecoration(id, static_cast<spv::Decoration>(decorate.first), literals);
        } else {
            if (member.has_value())
                builder.addMemberDecoration(id, *member, static_cast<spv::Decoration>(decorate.first));
            else
                builder.addDecoration(id, static_cast<spv::Decoration>(decorate.first));
        }
    }

    // Add spirv_decorate_id
    if (member.has_value()) {
        // spirv_decorate_id not applied to members
        assert(spirvDecorate.decorateIds.empty());
    } else {
        for (auto& decorateId : spirvDecorate.decorateIds) {
            std::vector<spv::Id> operandIds;
            assert(!decorateId.second.empty());
            for (auto extraOperand : decorateId.second) {
                if (extraOperand->getQualifier().isFrontEndConstant())
                    operandIds.push_back(createSpvConstant(*extraOperand));
                else
                    operandIds.push_back(getSymbolId(extraOperand->getAsSymbolNode()));
            }
            builder.addDecorationId(id, static_cast<spv::Decoration>(decorateId.first), operandIds);
        }
    }

    // Add spirv_decorate_string
    for (auto& decorateString : spirvDecorate.decorateStrings) {
        std::vector<const char*> strings;
        assert(!decorateString.second.empty());
        for (auto extraOperand : decorateString.second) {
            const char* string = extraOperand->getConstArray()[0].getSConst()->c_str();
            strings.push_back(string);
        }
        if (member.has_value())
            builder.addMemberDecoration(id, *member, static_cast<spv::Decoration>(decorateString.first), strings);
        else
            builder.addDecoration(id, static_cast<spv::Decoration>(decorateString.first), strings);
    }
}